

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::selectAll(QAbstractItemViewPrivate *this,SelectionFlags command)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  QItemSelectionModel *pQVar6;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QModelIndex br;
  QModelIndex tl;
  QItemSelection selection;
  rvalue_ref t;
  QModelIndex *bottomR;
  QModelIndex *topL;
  QItemSelectionRange *this_00;
  QPersistentModelIndex local_d0 [3];
  QPersistentModelIndex local_b8 [3];
  QPersistentModelIndex local_a0 [3];
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QPersistentModelIndex local_70 [3];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28 [3];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x81157e);
  if (bVar2) {
    plVar1 = *(long **)(in_RDI + 0x2f8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
    bVar3 = (**(code **)(*plVar1 + 0x88))(plVar1,local_28);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection((QItemSelection *)0x811609);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      t = *(rvalue_ref *)(in_RDI + 0x2f8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
      (**(code **)((t->tl).d + 0x60))(&local_58,t,0,0,local_70);
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = *(QItemSelectionRange **)(in_RDI + 0x2f8);
      bottomR = *(QModelIndex **)(in_RDI + 0x2f8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_a0);
      iVar4 = (**(code **)(*(long *)bottomR + 0x78))(bottomR,local_a0);
      topL = *(QModelIndex **)(in_RDI + 0x2f8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
      iVar5 = (**(code **)(*(long *)topL + 0x80))(topL,local_b8);
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_d0);
      (**(code **)((this_00->tl).d + 0x60))(&local_88,this_00,iVar4 + -1,iVar5 + -1,local_d0);
      QItemSelectionRange::QItemSelectionRange(this_00,topL,bottomR);
      QList<QItemSelectionRange>::append((QList<QItemSelectionRange> *)bottomR,t);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)bottomR);
      pQVar6 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8117a9);
      (**(code **)(*(long *)pQVar6 + 0x70))(pQVar6,&local_40,local_c);
      QItemSelection::~QItemSelection((QItemSelection *)0x8117d6);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::selectAll(QItemSelectionModel::SelectionFlags command)
{
    if (!selectionModel)
        return;
    if (!model->hasChildren(root))
        return;

    QItemSelection selection;
    QModelIndex tl = model->index(0, 0, root);
    QModelIndex br = model->index(model->rowCount(root) - 1,
                                  model->columnCount(root) - 1,
                                  root);
    selection.append(QItemSelectionRange(tl, br));
    selectionModel->select(selection, command);
}